

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_copy_into(mp_int *dest,mp_int *src)

{
  size_t sVar1;
  size_t copy_nw;
  mp_int *src_local;
  mp_int *dest_local;
  
  sVar1 = size_t_min(dest->nw,src->nw);
  memmove(dest->w,src->w,sVar1 << 3);
  smemclr(dest->w + sVar1,(dest->nw - sVar1) * 8);
  return;
}

Assistant:

void mp_copy_into(mp_int *dest, mp_int *src)
{
    size_t copy_nw = size_t_min(dest->nw, src->nw);
    memmove(dest->w, src->w, copy_nw * sizeof(BignumInt));
    smemclr(dest->w + copy_nw, (dest->nw - copy_nw) * sizeof(BignumInt));
}